

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view_archive.cpp
# Opt level: O0

void __thiscall
SStringViewArchive_WriteHello_Test::TestBody(SStringViewArchive_WriteHello_Test *this)

{
  bool bVar1;
  char *pcVar2;
  address addr;
  database_reader *archive;
  undefined1 *puVar3;
  AssertHelper local_180;
  Message local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_1;
  shared_sstring_view actual;
  undefined1 local_140 [8];
  database_reader reader;
  Message local_128;
  address local_120;
  address local_118;
  vector<char,_std::allocator<char>_> local_110;
  undefined1 local_f7;
  char local_f6 [15];
  char local_e7 [7];
  undefined1 local_e0 [8];
  AssertionResult gtest_ar;
  typed_address<char> local_c8;
  typed_address<char> last;
  undefined1 local_b8 [8];
  database_writer writer;
  typed_address<char> local_90;
  typed_address<char> first;
  unique_lock<mock_mutex> local_78;
  undefined1 local_68 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction;
  undefined1 local_28 [7];
  mock_mutex mutex;
  shared_sstring_view str;
  SStringViewArchive_WriteHello_Test *this_local;
  
  anon_unknown.dwarf_211f4e::SStringViewArchive::make_shared_sstring_view
            ((shared_sstring_view *)local_28,"hello");
  std::unique_lock<mock_mutex>::unique_lock(&local_78,(mutex_type *)&transaction.lock_.field_0xf);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_68,
          &(this->super_SStringViewArchive).db_,&local_78);
  std::unique_lock<mock_mutex>::~unique_lock(&local_78);
  writer.super_writer_base<pstore::serialize::archive::details::database_writer_policy>._24_8_ =
       anon_unknown.dwarf_211f4e::SStringViewArchive::current_pos
                 (&this->super_SStringViewArchive,(transaction_base *)local_68);
  pstore::typed_address<char>::typed_address
            (&local_90,
             (address)writer.
                      super_writer_base<pstore::serialize::archive::details::database_writer_policy>
                      ._24_8_);
  pstore::serialize::archive::make_writer((database_writer *)local_b8,(transaction_base *)local_68);
  last.a_.a_ = pstore::serialize::
               write<pstore::serialize::archive::database_writer&,pstore::sstring_view<std::shared_ptr<char_const>>>
                         ((database_writer *)local_b8,
                          (sstring_view<std::shared_ptr<const_char>_> *)local_28);
  pstore::serialize::archive::database_writer::~database_writer((database_writer *)local_b8);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )anon_unknown.dwarf_211f4e::SStringViewArchive::current_pos
                   (&this->super_SStringViewArchive,(transaction_base *)local_68);
  pstore::typed_address<char>::typed_address
            (&local_c8,
             (address)gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_f6[5] = 0xb;
  builtin_strncpy(local_f6,"lleh",5);
  local_f7 = 0x6f;
  puVar3 = &local_f7;
  testing::ElementsAre<char,char,char,char,char,char,char>
            (local_f6 + 6,local_f6 + 5,local_f6 + 4,local_f6 + 3,local_f6 + 2,local_f6 + 1,local_f6)
  ;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char,char,char,char,char,char,char>>>
            ((tuple<char,_char,_char,_char,_char,_char,_char>)SUB87(puVar3,0));
  local_118 = local_90.a_.a_;
  local_120 = local_c8.a_.a_;
  anon_unknown.dwarf_211f4e::SStringViewArchive::as_vector
            (&local_110,&this->super_SStringViewArchive,local_90,local_c8);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char,char,char,char,char,char,char>>>
  ::operator()(local_e0,local_e7,(vector<char,_std::allocator<char>_> *)"as_vector (first, last)");
  std::vector<char,_std::allocator<char>_>::~vector(&local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&reader.addr_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_sstring_view_archive.cpp"
               ,0x7d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&reader.addr_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&reader.addr_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  addr = pstore::typed_address<char>::to_address(&local_90);
  pstore::serialize::archive::database_reader::database_reader
            ((database_reader *)local_140,&(this->super_SStringViewArchive).db_,addr);
  pstore::serialize::
  read<pstore::sstring_view<std::shared_ptr<char_const>>,pstore::serialize::archive::database_reader&>
            ((sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar_1.message_,
             (serialize *)local_140,archive);
  testing::internal::EqHelper::
  Compare<pstore::sstring_view<std::shared_ptr<const_char>_>,_char[6],_nullptr>
            ((EqHelper *)local_170,"actual","\"hello\"",
             (sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar_1.message_,
             (char (*) [6])"hello");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_sstring_view_archive.cpp"
               ,0x81,pcVar2);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  pstore::sstring_view<std::shared_ptr<const_char>_>::~sstring_view
            ((sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar_1.message_);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_68);
  pstore::sstring_view<std::shared_ptr<const_char>_>::~sstring_view
            ((sstring_view<std::shared_ptr<const_char>_> *)local_28);
  return;
}

Assistant:

TEST_F (SStringViewArchive, WriteHello) {
    auto str = make_shared_sstring_view ("hello");

    mock_mutex mutex;
    auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});
    auto const first = pstore::typed_address<char> (this->current_pos (transaction));
    {
        auto writer = pstore::serialize::archive::make_writer (transaction);
        pstore::serialize::write (writer, str);
    }
    auto const last = pstore::typed_address<char> (this->current_pos (transaction));
    EXPECT_THAT (as_vector (first, last),
                 ::testing::ElementsAre ('\xb', '\x0', 'h', 'e', 'l', 'l', 'o'));
    {
        auto reader = pstore::serialize::archive::database_reader{db_, first.to_address ()};
        shared_sstring_view const actual = pstore::serialize::read<shared_sstring_view> (reader);
        EXPECT_EQ (actual, "hello");
    }
}